

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O0

uint ParseScriptFlags(string *strFlags)

{
  long lVar1;
  string_view str;
  bool bVar2;
  size_type sVar3;
  mapped_type_conflict *pmVar4;
  unit_test_log_t *in_RDI;
  long in_FS_OFFSET;
  string *word;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  uint flags;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined8 in_stack_fffffffffffffeb0;
  char sep;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  lazy_ostream *in_stack_fffffffffffffec0;
  size_t line_num;
  size_t in_stack_fffffffffffffed0;
  const_string *file;
  uint local_ec;
  const_string local_d8 [5];
  lazy_ostream local_88 [3];
  
  sep = (char)((ulong)in_stack_fffffffffffffeb0 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_ec = 0;
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (in_stack_fffffffffffffe98);
  if ((!bVar2) &&
     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                              (char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0))
     , !bVar2)) {
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    str._M_str = (char *)in_RDI;
    str._M_len = in_stack_fffffffffffffed0;
    util::SplitString_abi_cxx11_(str,sep);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    while (bVar2 = __gnu_cxx::
                   operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0)),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffe98);
      sVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                      (key_type *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
      if (sVar3 == 0) {
        file = (const_string *)0x0;
        do {
          line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     (pointer)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                     (unsigned_long)in_stack_fffffffffffffe98);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffffe98);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (in_RDI,file,line_num,(const_string *)in_stack_fffffffffffffec0);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)
                     CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     (bool)in_stack_fffffffffffffea7);
          in_stack_fffffffffffffec0 = boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<
                    ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                     (char (*) [38])in_stack_fffffffffffffe98);
          boost::unit_test::operator<<
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[38],_const_char_(&)[38]>
                      *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                     in_stack_fffffffffffffe98);
          boost::unit_test::operator<<
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[38],_const_char_(&)[38]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                     (char (*) [2])in_stack_fffffffffffffe98);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     (pointer)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                     (unsigned_long)in_stack_fffffffffffffe98);
          in_stack_fffffffffffffe98 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)(local_88 + 2),local_88,local_d8,0x54,CHECK);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[38],_const_char_(&)[38]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[2],_const_char_(&)[2]>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[38],_const_char_(&)[38]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[2],_const_char_(&)[2]>
                      *)in_stack_fffffffffffffe98);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[38],_const_char_(&)[38]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[38],_const_char_(&)[38]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)in_stack_fffffffffffffe98);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[38],_const_char_(&)[38]>::
          ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[38],_const_char_(&)[38]>
                              *)in_stack_fffffffffffffe98);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_fffffffffffffe98);
          in_stack_fffffffffffffebf = boost::test_tools::tt_detail::dummy_cond();
        } while ((bool)in_stack_fffffffffffffebf);
      }
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)in_stack_fffffffffffffec0,
                            (key_type *)
                            CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      local_ec = *pmVar4 | local_ec;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffe98);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_ec;
}

Assistant:

unsigned int ParseScriptFlags(std::string strFlags)
{
    unsigned int flags = SCRIPT_VERIFY_NONE;
    if (strFlags.empty() || strFlags == "NONE") return flags;

    std::vector<std::string> words = SplitString(strFlags, ',');
    for (const std::string& word : words)
    {
        if (!mapFlagNames.count(word))
            BOOST_ERROR("Bad test: unknown verification flag '" << word << "'");
        flags |= mapFlagNames[word];
    }
    return flags;
}